

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsCalibration.cpp
# Opt level: O3

void __thiscall deqp::gls::TheilSenCalibrator::clear(TheilSenCalibrator *this)

{
  pointer puVar1;
  pointer pCVar2;
  
  (this->m_measureState).maxNumFrames = 0;
  (this->m_measureState).frameShortcutTime = INFINITY;
  (this->m_measureState).numDrawCalls = 0;
  puVar1 = (this->m_measureState).frameTimes.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_measureState).frameTimes.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_measureState).frameTimes.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pCVar2 = (this->m_calibrateIterations).
           super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_calibrateIterations).
      super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (this->m_calibrateIterations).
    super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
  }
  this->m_state = INTERNALSTATE_CALIBRATING;
  return;
}

Assistant:

void TheilSenCalibrator::clear (void)
{
	m_measureState.clear();
	m_calibrateIterations.clear();
	m_state = INTERNALSTATE_CALIBRATING;
}